

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O2

mat4 * dja::mat4::homogeneous::scale(mat4 *__return_storage_ptr__,float_t value)

{
  mat3 local_2c;
  
  local_2c.m[0].y = 0.0;
  local_2c.m[0].z = 0.0;
  local_2c.m[1].x = 0.0;
  local_2c.m[1].z = 0.0;
  local_2c.m[2].x = 0.0;
  local_2c.m[2].y = 0.0;
  local_2c.m[0].x = value;
  local_2c.m[1].y = value;
  local_2c.m[2].z = value;
  from_mat3(&local_2c);
  return __return_storage_ptr__;
}

Assistant:

mat4 mat4::homogeneous::scale(float_t value)
{
    return mat4::homogeneous::from_mat3(mat3::scale(value));
}